

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O0

uint8_t * WebPDecodeYUV(uint8_t *data,size_t data_size,int *width,int *height,uint8_t **u,
                       uint8_t **v,int *stride,int *uv_stride)

{
  undefined8 *in_R8;
  undefined8 *in_R9;
  WebPYUVABuffer *buf;
  uint8_t *out;
  WebPDecBuffer output;
  undefined8 local_98;
  undefined8 local_90;
  undefined4 local_80;
  undefined4 local_7c;
  uint8_t *local_8;
  
  if ((((in_R8 == (undefined8 *)0x0) || (in_R9 == (undefined8 *)0x0)) ||
      (buf == (WebPYUVABuffer *)0x0)) || (out == (uint8_t *)0x0)) {
    local_8 = (uint8_t *)0x0;
  }
  else {
    local_8 = Decode(output.u.YUVA.u_stride,output.u.YUVA.a,output.u.RGBA.size,
                     (int *)output.u.YUVA.u,(int *)output.u.RGBA.rgba,(WebPDecBuffer *)output._8_8_)
    ;
    if (local_8 != (uint8_t *)0x0) {
      *in_R8 = local_98;
      *in_R9 = local_90;
      *(undefined4 *)&buf->y = local_80;
      *(undefined4 *)out = local_7c;
    }
  }
  return local_8;
}

Assistant:

uint8_t* WebPDecodeYUV(const uint8_t* data, size_t data_size,
                       int* width, int* height, uint8_t** u, uint8_t** v,
                       int* stride, int* uv_stride) {
  // data, width and height are checked by Decode().
  if (u == NULL || v == NULL || stride == NULL || uv_stride == NULL) {
    return NULL;
  }

  {
    WebPDecBuffer output;   // only to preserve the side-infos
    uint8_t* const out = Decode(MODE_YUV, data, data_size,
                                width, height, &output);

    if (out != NULL) {
      const WebPYUVABuffer* const buf = &output.u.YUVA;
      *u = buf->u;
      *v = buf->v;
      *stride = buf->y_stride;
      *uv_stride = buf->u_stride;
      assert(buf->u_stride == buf->v_stride);
    }
    return out;
  }
}